

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvnc.cpp
# Opt level: O3

ssize_t __thiscall
QRfbSetEncodings::read(QRfbSetEncodings *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  long lVar2;
  undefined4 in_register_00000034;
  long *plVar3;
  long in_FS_OFFSET;
  char tmp;
  undefined1 local_21;
  long local_20;
  
  plVar3 = (long *)CONCAT44(in_register_00000034,__fd);
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (**(code **)(*plVar3 + 0xa0))(plVar3);
  lVar2 = lVar1;
  if (2 < lVar1) {
    local_21 = 0xaa;
    QIODevice::read((char *)plVar3,(longlong)&local_21);
    lVar2 = QIODevice::read((char *)plVar3,(longlong)this);
    this->count = this->count << 8 | this->count >> 8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return CONCAT71((int7)((ulong)lVar2 >> 8),2 < lVar1);
  }
  __stack_chk_fail();
}

Assistant:

bool QRfbSetEncodings::read(QTcpSocket *s)
{
    if (s->bytesAvailable() < 3)
        return false;

    char tmp;
    s->read(&tmp, 1);        // padding
    s->read(reinterpret_cast<char *>(&count), 2);
    count = ntohs(count);

    return true;
}